

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_scan.cpp
# Opt level: O0

wchar_t * ON_wString::ToNumber(wchar_t *buffer,double value_on_failure,double *value)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int *piVar4;
  double local_248;
  double x;
  ulong uStack_238;
  bool bHaveMantissa;
  size_t local_buffer_count;
  size_t local_buffer_capacity;
  char local_buffer [512];
  double *value_local;
  double value_on_failure_local;
  wchar_t *buffer_local;
  
  if ((value != (double *)0x0) && (*value = value_on_failure, buffer != (wchar_t *)0x0)) {
    local_buffer_count = 0x200;
    uStack_238 = 0;
    if ((*buffer == L'-') || (value_on_failure_local = (double)buffer, *buffer == L'+')) {
      value_on_failure_local = (double)(buffer + 1);
      local_buffer_capacity._0_1_ = (undefined1)*buffer;
      uStack_238 = 1;
    }
    x._7_1_ = '\0';
    while( true ) {
      bVar1 = false;
      if (0x2f < *(int *)value_on_failure_local) {
        bVar1 = *(int *)value_on_failure_local < 0x3a;
      }
      if (!bVar1) {
        if (*(int *)value_on_failure_local == 0x2e) {
          if (0x1ff < uStack_238) {
            return (wchar_t *)0x0;
          }
          local_buffer[uStack_238 - 8] = (char)*(undefined4 *)value_on_failure_local;
          uVar2 = uStack_238;
          while( true ) {
            value_on_failure_local = (double)((long)value_on_failure_local + 4);
            uStack_238 = uVar2 + 1;
            bVar1 = false;
            if (0x2f < *(int *)value_on_failure_local) {
              bVar1 = *(int *)value_on_failure_local < 0x3a;
            }
            if (!bVar1) break;
            if (0x1ff < uStack_238) {
              return (wchar_t *)0x0;
            }
            local_buffer[uVar2 - 7] = (char)*(undefined4 *)value_on_failure_local;
            x._7_1_ = '\x01';
            uVar2 = uStack_238;
          }
        }
        if (x._7_1_ == '\0') {
          return (wchar_t *)0x0;
        }
        if ((*(int *)value_on_failure_local == 0x65) || (*(int *)value_on_failure_local == 0x45)) {
          if (0x1ff < uStack_238) {
            return (wchar_t *)0x0;
          }
          piVar4 = (int *)((long)value_on_failure_local + 4);
          local_buffer[uStack_238 - 8] = (char)*(undefined4 *)value_on_failure_local;
          if ((*piVar4 == 0x2d) || (uVar2 = uStack_238 + 1, *piVar4 == 0x2b)) {
            if (0x1ff < uStack_238 + 1) {
              return (wchar_t *)0x0;
            }
            local_buffer[uStack_238 - 7] = (char)*piVar4;
            uVar2 = uStack_238 + 2;
            piVar4 = (int *)((long)value_on_failure_local + 8);
          }
          while( true ) {
            value_on_failure_local = (double)piVar4;
            uStack_238 = uVar2;
            bVar1 = false;
            if (0x2f < *(int *)value_on_failure_local) {
              bVar1 = *(int *)value_on_failure_local < 0x3a;
            }
            if (!bVar1) break;
            if (0x1ff < uStack_238) {
              return (wchar_t *)0x0;
            }
            local_buffer[uStack_238 - 8] = (char)*(undefined4 *)value_on_failure_local;
            uVar2 = uStack_238 + 1;
            piVar4 = (int *)((long)value_on_failure_local + 4);
          }
        }
        local_buffer._504_8_ = value;
        local_buffer[uStack_238 - 8] = '\0';
        local_248 = value_on_failure;
        uStack_238 = uStack_238 + 1;
        iVar3 = __isoc99_sscanf(&local_buffer_capacity,"%lg",&local_248);
        if (iVar3 != 1) {
          *(double *)local_buffer._504_8_ = value_on_failure;
          return (wchar_t *)0x0;
        }
        *(double *)local_buffer._504_8_ = local_248;
        return (wchar_t *)value_on_failure_local;
      }
      if (0x1ff < uStack_238) break;
      local_buffer[uStack_238 - 8] = (char)*(undefined4 *)value_on_failure_local;
      x._7_1_ = '\x01';
      uStack_238 = uStack_238 + 1;
      value_on_failure_local = (double)((long)value_on_failure_local + 4);
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t* ON_wString::ToNumber(
  const wchar_t* buffer,
  double value_on_failure,
  double* value
  )
{
  if (nullptr == value)
    return nullptr;
  *value = value_on_failure;
  if (nullptr == buffer)
    return nullptr;

  char local_buffer[512];
  const size_t local_buffer_capacity = sizeof(local_buffer) / sizeof(local_buffer[0]);
  size_t local_buffer_count = 0;

  if ('-' == *buffer || '+' == *buffer)
    local_buffer[local_buffer_count++] = (char)(*buffer++);

  bool bHaveMantissa = false;
  while (buffer[0] >= '0' && buffer[0] <= '9')
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);
    bHaveMantissa = true;
  }

  if ('.' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
      bHaveMantissa = true;
    }
  }

  if (false == bHaveMantissa)
    return nullptr;

  if ('e' == *buffer || 'E' == *buffer)
  {
    if (local_buffer_count >= local_buffer_capacity)
      return nullptr;
    local_buffer[local_buffer_count++] = (char)(*buffer++);

    if ('-' == *buffer || '+' == *buffer)
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }

    while (buffer[0] >= '0' && buffer[0] <= '9')
    {
      if (local_buffer_count >= local_buffer_capacity)
        return nullptr;
      local_buffer[local_buffer_count++] = (char)(*buffer++);
    }
  }

  local_buffer[local_buffer_count++] = 0;

  double x = value_on_failure;
#if defined(ON_COMPILER_CLANG) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
#if defined(ON_RUNTIME_ANDROID) || defined(ON_RUNTIME_LINUX) || defined(ON_RUNTIME_WASM)
  if (1 == sscanf(local_buffer, "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#else
  if (1 == sscanf_l(local_buffer, ON_Locale::InvariantCulture.NumericLocalePtr(), "%lg", &x))
  {
    *value = x;
    return buffer;
  }
#endif
#else
  if (1 == _sscanf_s_l(local_buffer, "%lg", ON_Locale::InvariantCulture.NumericLocalePtr(), &x))
  {
    *value = x;
    return buffer;
  }
#endif
  *value = value_on_failure;
  return nullptr;
}